

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseQNameAndCompare(xmlParserCtxtPtr ctxt,xmlChar *name,xmlChar *prefix)

{
  bool bVar1;
  xmlChar *local_48;
  xmlChar *prefix2;
  xmlChar *ret;
  xmlChar *in;
  xmlChar *cmp;
  xmlChar *prefix_local;
  xmlChar *name_local;
  xmlParserCtxtPtr ctxt_local;
  
  cmp = prefix;
  prefix_local = name;
  name_local = (xmlChar *)ctxt;
  if (prefix == (xmlChar *)0x0) {
    ctxt_local = (xmlParserCtxtPtr)xmlParseNameAndCompare(ctxt,name);
  }
  else {
    if (((ctxt->input->flags & 0x40U) == 0) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    ret = *(xmlChar **)(*(long *)(name_local + 0x38) + 0x20);
    in = cmp;
    while( true ) {
      bVar1 = false;
      if (*ret != '\0') {
        bVar1 = *ret == *in;
      }
      if (!bVar1) break;
      ret = ret + 1;
      in = in + 1;
    }
    if ((*in == '\0') && (*ret == ':')) {
      in = prefix_local;
      while( true ) {
        ret = ret + 1;
        bVar1 = false;
        if (*ret != '\0') {
          bVar1 = *ret == *in;
        }
        if (!bVar1) break;
        in = in + 1;
      }
      if ((*in == '\0') &&
         ((((*ret == '>' || (*ret == ' ')) || ((8 < *ret && (*ret < 0xb)))) || (*ret == '\r')))) {
        *(int *)(*(long *)(name_local + 0x38) + 0x38) =
             *(int *)(*(long *)(name_local + 0x38) + 0x38) +
             ((int)ret - (int)*(undefined8 *)(*(long *)(name_local + 0x38) + 0x20));
        *(xmlChar **)(*(long *)(name_local + 0x38) + 0x20) = ret;
        return (xmlChar *)0x1;
      }
    }
    ctxt_local = (xmlParserCtxtPtr)xmlParseQName((xmlParserCtxtPtr)name_local,&local_48);
    if (ctxt_local == (xmlParserCtxtPtr)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else if ((ctxt_local == (xmlParserCtxtPtr)prefix_local) && (cmp == local_48)) {
      ctxt_local = (xmlParserCtxtPtr)0x1;
    }
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static const xmlChar *
xmlParseQNameAndCompare(xmlParserCtxtPtr ctxt, xmlChar const *name,
                        xmlChar const *prefix) {
    const xmlChar *cmp;
    const xmlChar *in;
    const xmlChar *ret;
    const xmlChar *prefix2;

    if (prefix == NULL) return(xmlParseNameAndCompare(ctxt, name));

    GROW;
    in = ctxt->input->cur;

    cmp = prefix;
    while (*in != 0 && *in == *cmp) {
	++in;
	++cmp;
    }
    if ((*cmp == 0) && (*in == ':')) {
        in++;
	cmp = name;
	while (*in != 0 && *in == *cmp) {
	    ++in;
	    ++cmp;
	}
	if (*cmp == 0 && (*in == '>' || IS_BLANK_CH (*in))) {
	    /* success */
            ctxt->input->col += in - ctxt->input->cur;
	    ctxt->input->cur = in;
	    return((const xmlChar*) 1);
	}
    }
    /*
     * all strings coms from the dictionary, equality can be done directly
     */
    ret = xmlParseQName (ctxt, &prefix2);
    if (ret == NULL)
        return(NULL);
    if ((ret == name) && (prefix == prefix2))
	return((const xmlChar*) 1);
    return ret;
}